

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

void lua_createtable(lua_State *L,int narray,int nrec)

{
  TValue *pTVar1;
  uint uVar2;
  ulong uVar3;
  GCtab *pGVar4;
  uint32_t hbits;
  uint32_t asize;
  
  uVar3 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar3 + 0x24) <= *(uint *)(uVar3 + 0x20)) {
    lj_gc_step(L);
  }
  asize = 0;
  if (0 < narray) {
    asize = narray + 1;
  }
  uVar2 = 0x1f;
  if (nrec - 1U != 0) {
    for (; nrec - 1U >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  hbits = (uVar2 ^ 0xffffffe0) + 0x21;
  if ((uint)nrec < 2) {
    hbits = nrec;
  }
  pGVar4 = lj_tab_new(L,asize,hbits);
  pTVar1 = L->top;
  (pTVar1->u32).lo = (uint32_t)pGVar4;
  (pTVar1->field_2).it = 0xfffffff4;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  if (pTVar1 + 1 < (TValue *)(ulong)(L->maxstack).ptr32) {
    return;
  }
  lj_state_growstack(L,1);
  return;
}

Assistant:

LUA_API void lua_createtable(lua_State *L, int narray, int nrec)
{
  GCtab *t;
  lj_gc_check(L);
  t = lj_tab_new(L, (uint32_t)(narray > 0 ? narray+1 : 0), hsize2hbits(nrec));
  settabV(L, L->top, t);
  incr_top(L);
}